

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O1

SimpleString __thiscall MockSupport::appendScopeToName(MockSupport *this,SimpleString *functionName)

{
  bool bVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  SimpleString SVar3;
  SimpleString local_40;
  SimpleString local_30;
  
  bVar1 = SimpleString::isEmpty(functionName + 7);
  if (bVar1) {
    SimpleString::SimpleString((SimpleString *)this,in_RDX);
    sVar2 = extraout_RDX;
  }
  else {
    SimpleString::SimpleString(&local_30,"::");
    SimpleString::operator+(&local_40,functionName + 7);
    SimpleString::operator+((SimpleString *)this,&local_40);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_30);
    sVar2 = extraout_RDX_00;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString MockSupport::appendScopeToName(const SimpleString& functionName)
{
    if (mockName_.isEmpty()) return functionName;
    return mockName_ + "::" + functionName;
}